

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_hpf_process_pcm_frames
                    (ma_hpf *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ma_hpf1 *pmVar12;
  ma_biquad_coefficient *pmVar13;
  ma_hpf2 *pmVar14;
  ma_result mVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined2 uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  float *pFramesInF32;
  ma_int16 *pFramesOutS16;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  mVar15 = MA_INVALID_ARGS;
  if (pHPF != (ma_hpf *)0x0) {
    if (pFramesOut == pFramesIn) {
      if (pHPF->hpf1Count != 0) {
        lVar18 = 0;
        uVar17 = 0;
        do {
          mVar15 = ma_hpf1_process_pcm_frames
                             ((ma_hpf1 *)((long)&pHPF->pHPF1->format + lVar18),pFramesOut,pFramesOut
                              ,frameCount);
          if (mVar15 != MA_SUCCESS) {
            return mVar15;
          }
          uVar17 = uVar17 + 1;
          lVar18 = lVar18 + 0x28;
        } while (uVar17 < pHPF->hpf1Count);
      }
      if (pHPF->hpf2Count != 0) {
        lVar18 = 0;
        uVar17 = 0;
        do {
          if (pHPF->pHPF2 == (ma_hpf2 *)0x0) {
            return MA_INVALID_ARGS;
          }
          mVar15 = ma_biquad_process_pcm_frames
                             ((ma_biquad *)((long)&(pHPF->pHPF2->bq).format + lVar18),pFramesOut,
                              pFramesOut,frameCount);
          if (mVar15 != MA_SUCCESS) {
            return mVar15;
          }
          uVar17 = uVar17 + 1;
          lVar18 = lVar18 + 0x40;
        } while (uVar17 < pHPF->hpf2Count);
      }
    }
    else if (pHPF->format == ma_format_f32) {
      if (frameCount != 0) {
        uVar17 = (ulong)pHPF->channels;
        uVar16 = 0;
        do {
          memcpy(pFramesOut,pFramesIn,
                 (ulong)(uint)((int)uVar17 * *(int *)(&DAT_0017b4a0 + (ulong)pHPF->format * 4)));
          if (pHPF->hpf1Count != 0) {
            uVar17 = 0;
            do {
              pmVar12 = pHPF->pHPF1;
              uVar6 = pmVar12[uVar17].channels;
              fVar26 = 1.0 - pmVar12[uVar17].a.f32;
              uVar21 = 0;
              do {
                pmVar13 = pmVar12[uVar17].pR1;
                fVar27 = *(float *)((long)pFramesOut + uVar21 * 4) * (1.0 - fVar26) +
                         pmVar13[uVar21].f32 * -fVar26;
                *(float *)((long)pFramesOut + uVar21 * 4) = fVar27;
                pmVar13[uVar21].f32 = fVar27;
                uVar21 = uVar21 + 1;
              } while (uVar6 != uVar21);
              uVar17 = uVar17 + 1;
            } while (uVar17 < pHPF->hpf1Count);
          }
          if (pHPF->hpf2Count != 0) {
            uVar17 = 0;
            do {
              pmVar14 = pHPF->pHPF2;
              uVar6 = pmVar14[uVar17].bq.channels;
              fVar26 = pmVar14[uVar17].bq.b0.f32;
              fVar27 = pmVar14[uVar17].bq.b1.f32;
              fVar1 = pmVar14[uVar17].bq.b2.f32;
              fVar2 = pmVar14[uVar17].bq.a1.f32;
              fVar3 = pmVar14[uVar17].bq.a2.f32;
              uVar21 = 0;
              do {
                pmVar13 = pmVar14[uVar17].bq.pR1;
                fVar4 = *(float *)((long)pFramesOut + uVar21 * 4);
                fVar28 = fVar26 * fVar4 + pmVar13[uVar21].f32;
                fVar5 = pmVar14[uVar17].bq.pR2[uVar21].f32;
                *(float *)((long)pFramesOut + uVar21 * 4) = fVar28;
                pmVar13[uVar21].f32 = fVar27 * fVar4 + fVar28 * -fVar2 + fVar5;
                pmVar14[uVar17].bq.pR2[uVar21].f32 = fVar4 * fVar1 + fVar28 * -fVar3;
                uVar21 = uVar21 + 1;
              } while (uVar6 != uVar21);
              uVar17 = uVar17 + 1;
            } while (uVar17 < pHPF->hpf2Count);
          }
          uVar17 = (ulong)pHPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar17 * 4);
          pFramesIn = (void *)((long)pFramesIn + uVar17 * 4);
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (uVar16 < frameCount);
      }
    }
    else {
      if (pHPF->format != ma_format_s16) {
        return MA_INVALID_OPERATION;
      }
      if (frameCount != 0) {
        uVar16 = (ulong)pHPF->channels;
        uVar17 = 0;
        do {
          memcpy(pFramesOut,pFramesIn,
                 (ulong)(uint)((int)uVar16 * *(int *)(&DAT_0017b4a0 + (ulong)pHPF->format * 4)));
          if (pHPF->hpf1Count != 0) {
            uVar16 = 0;
            do {
              pmVar12 = pHPF->pHPF1;
              uVar6 = pmVar12[uVar16].channels;
              iVar7 = pmVar12[uVar16].a.s32;
              uVar21 = 0;
              do {
                pmVar13 = pmVar12[uVar16].pR1;
                iVar22 = pmVar13[uVar21].s32 * (iVar7 + -0x4000) +
                         *(short *)((long)pFramesOut + uVar21 * 2) * iVar7 >> 0xe;
                *(short *)((long)pFramesOut + uVar21 * 2) = (short)iVar22;
                pmVar13[uVar21].s32 = iVar22;
                uVar21 = uVar21 + 1;
              } while (uVar6 != uVar21);
              uVar16 = uVar16 + 1;
            } while (uVar16 < pHPF->hpf1Count);
          }
          if (pHPF->hpf2Count != 0) {
            uVar16 = 0;
            do {
              pmVar14 = pHPF->pHPF2;
              uVar6 = pmVar14[uVar16].bq.channels;
              iVar7 = pmVar14[uVar16].bq.b0.s32;
              iVar22 = pmVar14[uVar16].bq.b1.s32;
              iVar8 = pmVar14[uVar16].bq.b2.s32;
              iVar9 = pmVar14[uVar16].bq.a1.s32;
              iVar10 = pmVar14[uVar16].bq.a2.s32;
              uVar21 = 0;
              do {
                pmVar13 = pmVar14[uVar16].bq.pR1;
                iVar23 = (int)*(short *)((long)pFramesOut + uVar21 * 2);
                iVar11 = pmVar14[uVar16].bq.pR2[uVar21].s32;
                iVar20 = iVar7 * iVar23 + pmVar13[uVar21].s32 >> 0xe;
                iVar24 = iVar9 * iVar20;
                iVar25 = iVar20 * iVar10;
                if (0x7ffe < iVar20) {
                  iVar20 = 0x7fff;
                }
                uVar19 = (undefined2)iVar20;
                if (iVar20 < -0x7fff) {
                  uVar19 = 0x8000;
                }
                *(undefined2 *)((long)pFramesOut + uVar21 * 2) = uVar19;
                pmVar13[uVar21].s32 = (iVar22 * iVar23 + iVar11) - iVar24;
                pmVar14[uVar16].bq.pR2[uVar21].s32 = iVar23 * iVar8 - iVar25;
                uVar21 = uVar21 + 1;
              } while (uVar6 != uVar21);
              uVar16 = uVar16 + 1;
            } while (uVar16 < pHPF->hpf2Count);
          }
          uVar16 = (ulong)pHPF->channels;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 2);
          pFramesIn = (void *)((long)pFramesIn + uVar16 * 2);
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (uVar17 < frameCount);
      }
    }
    mVar15 = MA_SUCCESS;
  }
  return mVar15;
}

Assistant:

MA_API ma_result ma_hpf_process_pcm_frames(ma_hpf* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
            result = ma_hpf1_process_pcm_frames(&pHPF->pHPF1[ihpf1], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }

        for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
            result = ma_hpf2_process_pcm_frames(&pHPF->pHPF2[ihpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pHPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_f32(&pHPF->pHPF1[ihpf1], pFramesOutF32, pFramesOutF32);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_f32(&pHPF->pHPF2[ihpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pHPF->channels;
                pFramesInF32  += pHPF->channels;
            }
        } else if (pHPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_s16(&pHPF->pHPF1[ihpf1], pFramesOutS16, pFramesOutS16);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_s16(&pHPF->pHPF2[ihpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pHPF->channels;
                pFramesInS16  += pHPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}